

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  ConductorBxDF *pCVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  byte bVar40;
  int i;
  uint uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  byte bVar45;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_00;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  ulong uVar49;
  uint uVar50;
  uint64_t oldstate;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_02;
  long in_FS_OFFSET;
  undefined8 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  Float FVar56;
  float fVar57;
  undefined4 extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar79 [56];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  uint in_XMM1_Db;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint in_XMM1_Dd;
  undefined1 auVar102 [56];
  undefined1 auVar93 [64];
  undefined1 auVar101 [60];
  float fVar105;
  float fVar106;
  ulong in_XMM2_Qb;
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined4 uVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_ZMM8 [64];
  undefined4 in_XMM9_Da;
  undefined1 in_register_00001444 [12];
  SampledSpectrum SVar115;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f VVar116;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  Vector3f wo_14;
  Vector3f wo_15;
  Vector3f wo_16;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wi_09;
  Vector3f wi_10;
  Vector3f wi_11;
  SampledSpectrum beta;
  SampledSpectrum fExit;
  Float pdf;
  SampledSpectrum fExit_1;
  BSDFSample wis;
  BSDFSample wos;
  undefined1 local_238 [16];
  undefined1 local_208 [4];
  float afStack_204 [3];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  ConductorBxDF *local_1d8;
  ushort local_1ca;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  ulong local_1b8;
  ulong uStack_1b0;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_1a8;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_1a0;
  float local_194;
  float local_190;
  uint local_18c;
  float local_188;
  uint uStack_184;
  undefined4 uStack_180;
  uint uStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  BSDFSample local_168;
  Tuple2<pbrt::Point2,_float> local_140;
  undefined1 local_138 [4];
  float afStack_134 [3];
  undefined1 local_128 [16];
  undefined8 uStack_118;
  float fStack_110;
  float fStack_10c;
  BxDFFlags local_108;
  undefined1 local_f8 [16];
  Tuple2<pbrt::Point2,_float> local_e0;
  TransportMode local_d4;
  float local_d0;
  float local_cc;
  ulong local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ulong uStack_78;
  float fStack_70;
  float fStack_6c;
  BxDFFlags local_68;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 extraout_var [60];
  undefined1 auVar94 [64];
  undefined1 auVar92 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  
  uStack_180 = 0;
  uStack_90 = 0;
  local_188 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_1b8 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_98 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uStack_1b0 = in_XMM2_Qb;
  uStack_c0 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (local_98 < 0.0)) {
    local_c8 = local_c8 ^ 0x8000000080000000;
    uStack_c0 = in_XMM0_Qb ^ 0x8000000080000000;
    local_98 = -local_98;
    in_XMM1_Db = in_XMM1_Db ^ 0x80000000;
    uStack_90 = 0x80000000;
    in_XMM1_Dd = in_XMM1_Dd ^ 0x80000000;
    local_1b8 = local_1b8 ^ 0x8000000080000000;
    uStack_1b0 = in_XMM2_Qb ^ 0x8000000080000000;
    local_188 = -local_188;
    in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
    uStack_180 = 0x80000000;
    in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
  }
  pCVar1 = &this->bottom;
  this_00 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
  this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)pCVar1;
  if (0.0 < local_98) {
    this_01 = this_00;
  }
  this_02 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
  if (0.0 < local_98) {
    this_02 = this;
  }
  bVar48 = 0.0 < local_188 * local_98 != 0.0 < local_98;
  local_1a8 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
  if (bVar48) {
    local_1a8 = this;
  }
  local_1d8 = pCVar1;
  local_1a0 = this_00;
  if (!bVar48) {
    this_00 = this;
    local_1d8 = (ConductorBxDF *)0x0;
    local_1a0 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)pCVar1;
  }
  local_a8 = ZEXT416((uint)this->thickness);
  local_178 = 0.0;
  fStack_174 = 0.0;
  fStack_170 = 0.0;
  fStack_16c = 0.0;
  uStack_184 = in_XMM3_Db;
  uStack_17c = in_XMM3_Dd;
  uStack_94 = in_XMM1_Db;
  uStack_8c = in_XMM1_Dd;
  if (0.0 < local_188 * local_98) {
    fVar55 = (float)(this->config).nSamples;
    auVar102 = ZEXT856(CONCAT44(in_XMM1_Dd,uStack_90));
    if (local_98 <= 0.0) {
      VVar116.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
      VVar116.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
      VVar116.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
      auVar79 = ZEXT856(uStack_c0);
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1b8;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
      SVar115 = ConductorBxDF::f((ConductorBxDF *)this_01,VVar116,wi_01,mode);
      auVar70._0_8_ = SVar115.values.values._8_8_;
      auVar70._8_56_ = auVar102;
      auVar58 = auVar70._0_16_;
      auVar112._0_8_ = SVar115.values.values._0_8_;
      auVar112._8_56_ = auVar79;
      auVar52 = auVar112._0_16_;
    }
    else {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
      auVar79 = ZEXT856(uStack_c0);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1b8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
      SVar115 = DielectricInterfaceBxDF::f(&this_02->top,wo_00,wi_00,mode);
      auVar92._0_8_ = SVar115.values.values._8_8_;
      auVar92._8_56_ = auVar102;
      auVar58 = auVar92._0_16_;
      auVar93._0_8_ = SVar115.values.values._0_8_;
      auVar93._8_56_ = auVar79;
      auVar52 = auVar93._0_16_;
    }
    auVar52 = vmovlhps_avx(auVar52,auVar58);
    local_178 = auVar52._0_4_ * fVar55;
    fStack_174 = auVar52._4_4_ * fVar55;
    fStack_170 = auVar52._8_4_ * fVar55;
    fStack_16c = auVar52._12_4_ * fVar55;
  }
  bVar45 = (this->config).nSamples;
  if (bVar45 != 0) {
    local_a8._0_4_ = (uint)!bVar48 * local_a8._0_4_;
    uVar49 = local_c8 * -0x395b586ca42e166b;
    auVar52._4_4_ = uStack_94;
    auVar52._0_4_ = local_98;
    auVar52._8_4_ = uStack_90;
    auVar52._12_4_ = uStack_8c;
    uVar49 = (CONCAT44((int)(uVar49 >> 0x20),local_98) ^
             ((uVar49 >> 0x2f ^ uVar49) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar49 = (uVar49 >> 0x2f ^ uVar49) * -0x395b586ca42e166b;
    uVar49 = (*(uint *)(Options + 4) & 0xffffff ^ uVar49 ^ 0x1a929e4d6f47a654 ^
             (uVar49 >> 0x2f | (ulong)(*(uint *)(Options + 4) & 0xff000000))) * -0x395b586ca42e166b;
    uVar49 = (uVar49 >> 0x2f ^ uVar49) * -0x395b586ca42e166b;
    lVar2 = (uVar49 >> 0x2f ^ uVar49) * 2 + 1;
    uVar49 = (CONCAT44(0x4fb7dae8,local_188) ^
             ((local_1b8 * -0x395b586ca42e166b >> 0x2f ^ local_1b8 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar49 = (uVar49 >> 0x2f ^ uVar49) * -0x395b586ca42e166b;
    uVar49 = (uVar49 >> 0x2f ^ uVar49) * 0x5851f42d4c957f2d + lVar2 * 0x5851f42d4c957f2e;
    local_d4 = (TransportMode)(mode == Radiance);
    uVar50 = 0;
    uVar51 = vcmpss_avx512f((undefined1  [16])0x0,auVar52,1);
    local_1ca = (ushort)uVar51 & 1;
    local_60 = this_02;
    do {
      uVar46 = uVar49 * 0x5851f42d4c957f2d + lVar2;
      uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar2;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar46;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar47;
      auVar58 = vpunpcklqdq_avx(auVar65,auVar103);
      auVar52 = vpsrlvq_avx2(auVar58,_DAT_0045e4d0);
      auVar54 = vpsrlvq_avx2(auVar58,_DAT_0045e4e0);
      auVar52 = vpshufd_avx(auVar52 ^ auVar54,0xe8);
      auVar58 = vpsrlq_avx(auVar58,0x3b);
      auVar58 = vpshufd_avx(auVar58,0xe8);
      auVar52 = vprorvd_avx512vl(auVar52,auVar58);
      auVar52 = vcvtudq2ps_avx512vl(auVar52);
      auVar58._8_4_ = 0x2f800000;
      auVar58._0_8_ = 0x2f8000002f800000;
      auVar58._12_4_ = 0x2f800000;
      auVar52 = vmulps_avx512vl(auVar52,auVar58);
      auVar54._8_4_ = 0x3f7fffff;
      auVar54._0_8_ = 0x3f7fffff3f7fffff;
      auVar54._12_4_ = 0x3f7fffff;
      auVar52 = vminps_avx512vl(auVar52,auVar54);
      local_e0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar52);
      if (local_98 <= 0.0) {
        _local_88 = ZEXT832(0) << 0x20;
        local_68 = Unset;
      }
      else {
        uVar41 = (uint)(uVar49 >> 0x2d) ^ (uint)(uVar49 >> 0x1b);
        bVar45 = (byte)(uVar49 >> 0x3b);
        auVar31._4_12_ = in_register_00001444;
        auVar31._0_4_ = in_XMM9_Da;
        auVar52 = vcvtusi2ss_avx512f(auVar31,uVar41 >> bVar45 | uVar41 << 0x20 - bVar45);
        auVar52 = vminss_avx(ZEXT416((uint)(auVar52._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
        DielectricInterfaceBxDF::Sample_f
                  ((BSDFSample *)local_88,&this_02->top,wo_01,auVar52._0_4_,(Point2f *)&local_e0,
                   mode,Transmission);
      }
      uVar49 = uVar47 * 0x5851f42d4c957f2d + lVar2;
      if (0.0 < fStack_6c) {
        if ((fStack_70 != 0.0) || (NAN(fStack_70))) {
          uVar46 = uVar49 * 0x5851f42d4c957f2d + lVar2;
          uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar2;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar46;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar47;
          auVar58 = vpunpcklqdq_avx(auVar59,auVar80);
          auVar52 = vpsrlvq_avx2(auVar58,_DAT_0045e4d0);
          auVar54 = vpsrlvq_avx2(auVar58,_DAT_0045e4e0);
          auVar52 = vpshufd_avx(auVar52 ^ auVar54,0xe8);
          auVar58 = vpsrlq_avx(auVar58,0x3b);
          auVar58 = vpshufd_avx(auVar58,0xe8);
          auVar52 = vprorvd_avx512vl(auVar52,auVar58);
          auVar52 = vcvtudq2ps_avx512vl(auVar52);
          auVar4._8_4_ = 0x2f800000;
          auVar4._0_8_ = 0x2f8000002f800000;
          auVar4._12_4_ = 0x2f800000;
          auVar52 = vmulps_avx512vl(auVar52,auVar4);
          auVar5._8_4_ = 0x3f7fffff;
          auVar5._0_8_ = 0x3f7fffff3f7fffff;
          auVar5._12_4_ = 0x3f7fffff;
          auVar52 = vminps_avx512vl(auVar52,auVar5);
          local_e0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar52);
          if (bVar48) {
            _local_128 = ZEXT832(0) << 0x20;
            local_108 = Unset;
          }
          else {
            uVar41 = (uint)(uVar49 >> 0x2d) ^ (uint)(uVar49 >> 0x1b);
            bVar45 = (byte)(uVar49 >> 0x3b);
            auVar52 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,uVar41 >> bVar45 | uVar41 << 0x20 - bVar45);
            auVar52 = vminss_avx(ZEXT416((uint)(auVar52._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            wo_02.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1b8;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
            DielectricInterfaceBxDF::Sample_f
                      ((BSDFSample *)local_128,&this_00->top,wo_02,auVar52._0_4_,
                       (Point2f *)&local_e0,local_d4,Transmission);
          }
          uVar49 = uVar47 * 0x5851f42d4c957f2d + lVar2;
          if (0.0 < fStack_10c) {
            if ((fStack_110 != 0.0) || (NAN(fStack_110))) {
              local_238._4_4_ = fStack_70;
              local_238._0_4_ = fStack_70;
              local_238._8_4_ = fStack_70;
              local_238._12_4_ = fStack_70;
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar52 = vandps_avx512vl(local_238,auVar6);
              auVar81._0_4_ = auVar52._0_4_ * (float)local_88._0_4_;
              auVar81._4_4_ = auVar52._4_4_ * (float)local_88._4_4_;
              auVar81._8_4_ = auVar52._8_4_ * fStack_80;
              auVar81._12_4_ = auVar52._12_4_ * fStack_7c;
              auVar7._4_4_ = fStack_6c;
              auVar7._0_4_ = fStack_6c;
              auVar7._8_4_ = fStack_6c;
              auVar7._12_4_ = fStack_6c;
              _local_208 = vdivps_avx512vl(auVar81,auVar7);
              this_02 = local_60;
              if ((this->config).maxDepth != '\0') {
                auVar60._4_4_ = fStack_10c;
                auVar60._0_4_ = fStack_10c;
                auVar60._8_4_ = fStack_10c;
                auVar60._12_4_ = fStack_10c;
                _local_58 = vdivps_avx(local_128,auVar60);
                local_cc = this->g;
                auVar112 = ZEXT864(uStack_78);
                auVar52 = vfmadd213ss_fma(ZEXT416((uint)local_cc),ZEXT416((uint)local_cc),
                                          SUB6416(ZEXT464(0x3f800000),0));
                local_18c = auVar52._0_4_;
                local_190 = local_cc + local_cc;
                auVar52 = vfnmadd213ss_fma(ZEXT416((uint)local_cc),ZEXT416((uint)local_cc),
                                           SUB6416(ZEXT464(0x3f800000),0));
                local_194 = auVar52._0_4_ * 0.07957747;
                uVar41 = 0;
                uVar46 = uVar49;
                local_1e8 = ZEXT416((uint)((byte)local_1ca & 1) * (int)this->thickness);
                do {
                  auVar52 = in_ZMM8._0_16_;
                  auVar113 = auVar112._0_16_;
                  fVar55 = 1.0;
                  if (3 < uVar41) {
                    lVar44 = 1;
                    auVar70 = ZEXT464((uint)local_208);
                    auVar93 = ZEXT464((uint)local_208);
                    do {
                      auVar58 = vmaxss_avx(ZEXT416(*(uint *)(local_208 + lVar44 * 4)),auVar93._0_16_
                                          );
                      auVar93 = ZEXT1664(auVar58);
                      lVar44 = lVar44 + 1;
                    } while (lVar44 != 4);
                    if (auVar58._0_4_ < 0.25) {
                      lVar44 = 1;
                      do {
                        auVar58 = vmaxss_avx(ZEXT416(*(uint *)(local_208 + lVar44 * 4)),
                                             auVar70._0_16_);
                        auVar70 = ZEXT1664(auVar58);
                        lVar44 = lVar44 + 1;
                      } while (lVar44 != 4);
                      auVar58 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar58._0_4_)),
                                           (undefined1  [16])0x0);
                      uVar49 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                      uVar42 = (uint)(uVar46 >> 0x2d) ^ (uint)(uVar46 >> 0x1b);
                      bVar45 = (byte)(uVar46 >> 0x3b);
                      auVar32._4_12_ = in_register_00001444;
                      auVar32._0_4_ = in_XMM9_Da;
                      auVar54 = vcvtusi2ss_avx512f(auVar32,uVar42 >> bVar45 |
                                                           uVar42 << 0x20 - bVar45);
                      auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      this_02 = local_60;
                      if (auVar54._0_4_ < auVar58._0_4_) break;
                      fVar105 = 1.0 - auVar58._0_4_;
                      auVar61._4_4_ = fVar105;
                      auVar61._0_4_ = fVar105;
                      auVar61._8_4_ = fVar105;
                      auVar61._12_4_ = fVar105;
                      _local_208 = vdivps_avx(_local_208,auVar61);
                      uVar46 = uVar49;
                    }
                  }
                  fVar105 = (this->albedo).values.values[0];
                  if ((fVar105 != 0.0) || (NAN(fVar105))) {
LAB_003ce72c:
                    uVar42 = (uint)(uVar46 >> 0x2d) ^ (uint)(uVar46 >> 0x1b);
                    bVar45 = (byte)(uVar46 >> 0x3b);
                    auVar33._4_12_ = in_register_00001444;
                    auVar33._0_4_ = in_XMM9_Da;
                    auVar58 = vcvtusi2ss_avx512f(auVar33,uVar42 >> bVar45 | uVar42 << 0x20 - bVar45)
                    ;
                    auVar58 = vminss_avx(ZEXT416((uint)(auVar58._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    in_ZMM8 = ZEXT1664(auVar52);
                    auVar71._0_4_ = logf(1.0 - auVar58._0_4_);
                    auVar71._4_60_ = extraout_var;
                    local_1f8 = auVar71._0_16_;
                    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                         f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg ==
                         '\0') &&
                       (iVar43 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar43 != 0)) {
                      StatRegisterer::StatRegisterer
                                ((StatRegisterer *)
                                 &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                  reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__
                                 ,(PixelAccumFunc)0x0);
                      __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                           ::
                                           f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                           ::reg);
                    }
                    uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                    auVar8._8_4_ = 0x7fffffff;
                    auVar8._0_8_ = 0x7fffffff7fffffff;
                    auVar8._12_4_ = 0x7fffffff;
                    auVar52 = vandps_avx512vl(local_238,auVar8);
                    fVar55 = -(float)local_1f8._0_4_ / (1.0 / auVar52._0_4_);
                    auVar36._12_4_ = 0;
                    auVar36._0_12_ = ZEXT812(0);
                    uVar51 = vcmpss_avx512f(auVar36 << 0x20,local_238,1);
                    bVar3 = (bool)((byte)uVar51 & 1);
                    fVar105 = local_1e8._0_4_;
                    fVar55 = fVar105 + (float)((uint)bVar3 * (int)fVar55 +
                                              (uint)!bVar3 * (int)-fVar55);
                    *(long *)(in_FS_OFFSET + -0x128) = *(long *)(in_FS_OFFSET + -0x128) + 1;
                    uVar49 = uVar46;
                    if ((fVar105 != fVar55) || (NAN(fVar105) || NAN(fVar55))) {
                      auVar37._12_4_ = 0;
                      auVar37._0_12_ = ZEXT812(0);
                      auVar39._12_4_ = 0;
                      auVar39._0_12_ = ZEXT812(0);
                      auVar82 = auVar39 << 0x20;
                      auVar52 = ZEXT416((uint)fVar55);
                      if ((fVar55 <= 0.0) || (this->thickness <= fVar55)) {
                        uVar51 = vcmpss_avx512f(auVar52,auVar37 << 0x20,1);
                        auVar52 = vminss_avx(ZEXT416((uint)this->thickness),auVar52);
                        auVar53._4_12_ = auVar52._4_12_;
                        auVar53._0_4_ = (uint)!(bool)((byte)uVar51 & 1) * auVar52._0_4_;
                        bVar3 = true;
                      }
                      else {
                        if (bVar48) {
                          auVar58 = vminss_avx(ZEXT416((uint)(local_1d8->mfDistrib).alpha_y),
                                               ZEXT416((uint)(local_1d8->mfDistrib).alpha_x));
                          bVar45 = (auVar58._0_4_ < 0.001) * '\b' + 9;
                        }
                        else {
                          auVar58 = vminss_avx(ZEXT416((uint)(this_00->top).mfDistrib.alpha_y),
                                               ZEXT416((uint)(this_00->top).mfDistrib.alpha_x));
                          bVar45 = (auVar58._0_4_ < 0.001) * '\b' + 0xb;
                        }
                        auVar58 = vmovshdup_avx(auVar113);
                        auVar70 = ZEXT1664(auVar58);
                        auVar54 = SUB6416(ZEXT464(0x3f800000),0);
                        local_1f8 = auVar52;
                        if (bVar45 < 0x10) {
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * uStack_118._4_4_)
                                                           ),auVar113,
                                                    ZEXT416((uint)(float)uStack_118));
                          auVar52 = vfmadd231ss_fma(auVar52,local_238,ZEXT416((uint)fStack_110));
                          auVar54 = vfmadd213ss_fma(auVar52,ZEXT416((uint)local_190),
                                                    ZEXT416(local_18c));
                          auVar52 = vmaxss_avx(auVar54,auVar37 << 0x20);
                          if (auVar52._0_4_ < 0.0) {
                            local_1c8._0_4_ = fStack_10c;
                            local_b8._0_4_ = auVar54._0_4_;
                            local_f8 = auVar58;
                            fVar105 = sqrtf(auVar52._0_4_);
                            auVar70 = ZEXT1664(local_f8);
                            fVar55 = (float)local_1f8._0_4_;
                          }
                          else {
                            auVar52 = vsqrtss_avx(auVar52,auVar52);
                            fVar105 = auVar52._0_4_;
                            local_1c8._0_4_ = fStack_10c;
                            local_b8._0_4_ = auVar54._0_4_;
                          }
                          fVar105 = local_194 / (fVar105 * (float)local_b8._0_4_);
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),
                                                    ZEXT416((uint)local_1c8._0_4_),
                                                    ZEXT416((uint)local_1c8._0_4_));
                          auVar54 = ZEXT416((uint)(((float)local_1c8._0_4_ * (float)local_1c8._0_4_)
                                                  / auVar52._0_4_));
                          auVar82._0_12_ = ZEXT812(0);
                          auVar82._12_4_ = 0;
                        }
                        fVar105 = 1.0;
                        uVar109 = 0;
                        uVar110 = 0;
                        uVar111 = 0;
                        auVar21._8_4_ = 0x7fffffff;
                        auVar21._0_8_ = 0x7fffffff7fffffff;
                        auVar21._12_4_ = 0x7fffffff;
                        local_b8 = vandps_avx512vl(ZEXT416((uint)(fVar55 - (float)local_a8._0_4_)),
                                                   auVar21);
                        _local_1c8 = auVar54;
                        if (1.1754944e-38 < local_b8._0_4_) {
                          auVar22._8_4_ = 0x80000000;
                          auVar22._0_8_ = 0x8000000080000000;
                          auVar22._12_4_ = 0x80000000;
                          auVar52 = vxorps_avx512vl(local_b8,auVar22);
                          auVar23._8_4_ = 0x7fffffff;
                          auVar23._0_8_ = 0x7fffffff7fffffff;
                          auVar23._12_4_ = 0x7fffffff;
                          auVar58 = vandps_avx512vl(ZEXT416((uint)fStack_110),auVar23);
                          local_f8 = auVar70._0_16_;
                          fVar105 = expf(auVar52._0_4_ / auVar58._0_4_);
                          auVar70 = ZEXT1664(local_f8);
                          auVar82 = ZEXT816(0) << 0x40;
                          uVar109 = extraout_XMM0_Db;
                          uVar110 = extraout_XMM0_Dc;
                          uVar111 = extraout_XMM0_Dd;
                        }
                        auVar114._0_4_ = (this->albedo).values.values[0] * (float)local_208;
                        auVar114._4_4_ = (this->albedo).values.values[1] * afStack_204[0];
                        auVar114._8_4_ = (this->albedo).values.values[2] * afStack_204[1];
                        auVar114._12_4_ = (this->albedo).values.values[3] * afStack_204[2];
                        auVar52 = vfmadd132ss_fma(auVar113,ZEXT416((uint)(auVar70._0_4_ *
                                                                         uStack_118._4_4_)),
                                                  ZEXT416((uint)(float)uStack_118));
                        auVar52 = vfmadd231ss_fma(auVar52,local_238,ZEXT416((uint)fStack_110));
                        auVar58 = vfmadd213ss_fma(auVar52,ZEXT416((uint)local_190),
                                                  ZEXT416(local_18c));
                        auVar52 = vmaxss_avx(auVar58,auVar82);
                        if (auVar52._0_4_ < 0.0) {
                          local_f8._4_4_ = uVar109;
                          local_f8._0_4_ = fVar105;
                          local_f8._8_4_ = uVar110;
                          local_f8._12_4_ = uVar111;
                          local_d0 = auVar58._0_4_;
                          local_48 = auVar114;
                          fVar106 = sqrtf(auVar52._0_4_);
                          auVar114 = local_48;
                          fVar105 = (float)local_f8._0_4_;
                          fVar55 = local_d0;
                        }
                        else {
                          auVar52 = vsqrtss_avx(auVar52,auVar52);
                          fVar106 = auVar52._0_4_;
                          fVar55 = auVar58._0_4_;
                        }
                        in_ZMM8 = ZEXT1664(auVar114);
                        auVar83._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                        auVar83._8_4_ = auVar112._8_4_ ^ 0x80000000;
                        auVar83._12_4_ = auVar112._12_4_ ^ 0x80000000;
                        fVar55 = local_194 / (fVar106 * fVar55);
                        fVar106 = local_1c8._0_4_;
                        local_178 = fVar105 * fVar106 * auVar114._0_4_ * fVar55 *
                                    (float)local_58._0_4_ + local_178;
                        fStack_174 = fVar105 * fVar106 * auVar114._4_4_ * fVar55 *
                                     (float)local_58._4_4_ + fStack_174;
                        fStack_170 = fVar105 * fVar106 * auVar114._8_4_ * fVar55 * fStack_50 +
                                     fStack_170;
                        fStack_16c = fVar105 * fVar106 * auVar114._12_4_ * fVar55 * fStack_4c +
                                     fStack_16c;
                        uVar51 = vmovlps_avx(auVar83);
                        local_168.f.values.values[2] = (float)(local_238._0_4_ ^ 0x80000000);
                        local_168.f.values.values[0] = (float)(int)uVar51;
                        local_168.f.values.values[1] = (float)(int)((ulong)uVar51 >> 0x20);
                        uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                        uVar49 = uVar47 * 0x5851f42d4c957f2d + lVar2;
                        auVar62._8_8_ = 0;
                        auVar62._0_8_ = uVar46;
                        auVar84._8_8_ = 0;
                        auVar84._0_8_ = uVar47;
                        auVar58 = vpunpcklqdq_avx(auVar62,auVar84);
                        auVar52 = vpsrlvq_avx2(auVar58,_DAT_0045e4d0);
                        auVar54 = vpsrlvq_avx2(auVar58,_DAT_0045e4e0);
                        auVar52 = vpshufd_avx(auVar52 ^ auVar54,0xe8);
                        auVar101 = ZEXT1260(auVar52._4_12_);
                        auVar58 = vpsrlq_avx(auVar58,0x3b);
                        auVar58 = vpshufd_avx(auVar58,0xe8);
                        auVar52 = vprorvd_avx512vl(auVar52,auVar58);
                        auVar52 = vcvtudq2ps_avx512vl(auVar52);
                        auVar24._8_4_ = 0x2f800000;
                        auVar24._0_8_ = 0x2f8000002f800000;
                        auVar24._12_4_ = 0x2f800000;
                        auVar52 = vmulps_avx512vl(auVar52,auVar24);
                        auVar25._8_4_ = 0x3f7fffff;
                        auVar25._0_8_ = 0x3f7fffff3f7fffff;
                        auVar25._12_4_ = 0x3f7fffff;
                        auVar52 = vminps_avx512vl(auVar52,auVar25);
                        _local_138 = vmovlps_avx(auVar52);
                        auVar102 = (undefined1  [56])0x0;
                        VVar116 = SampleHenyeyGreenstein
                                            ((Vector3f *)&local_168,local_cc,(Point2f *)local_138,
                                             &local_140.x);
                        auVar94._0_4_ = VVar116.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar94._4_60_ = auVar101;
                        auVar72._0_8_ = VVar116.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar72._8_56_ = auVar102;
                        bVar3 = false;
                        auVar53 = local_1e8;
                        if ((0.0 < local_140.x) && ((auVar94._0_4_ != 0.0 || (NAN(auVar94._0_4_)))))
                        {
                          local_1e8 = ZEXT416((uint)local_140.x);
                          auVar63._4_4_ = local_140.x;
                          auVar63._0_4_ = local_140.x;
                          auVar63._8_4_ = local_140.x;
                          auVar63._12_4_ = local_140.x;
                          auVar85._0_4_ = local_140.x * (this->albedo).values.values[0];
                          auVar85._4_4_ = local_140.x * (this->albedo).values.values[1];
                          auVar85._8_4_ = local_140.x * (this->albedo).values.values[2];
                          auVar85._12_4_ = local_140.x * (this->albedo).values.values[3];
                          auVar52 = vdivps_avx(auVar85,auVar63);
                          afStack_204[0] = auVar52._4_4_ * afStack_204[0];
                          local_208 = (undefined1  [4])(auVar52._0_4_ * (float)local_208);
                          afStack_204[1] = auVar52._8_4_ * afStack_204[1];
                          afStack_204[2] = auVar52._12_4_ * afStack_204[2];
                          if (bVar48) {
                            auVar52 = vminss_avx(ZEXT416((uint)(local_1d8->mfDistrib).alpha_y),
                                                 ZEXT416((uint)(local_1d8->mfDistrib).alpha_x));
                            bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 9;
                          }
                          else {
                            auVar52 = vminss_avx(ZEXT416((uint)(this_00->top).mfDistrib.alpha_y),
                                                 ZEXT416((uint)(this_00->top).mfDistrib.alpha_x));
                            bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 0xb;
                          }
                          if (bVar45 < 0x10) {
                            local_1c8 = (undefined1  [8])(auVar72._0_8_ ^ 0x8000000080000000);
                            fStack_1c0 = (float)(auVar102._0_4_ ^ 0x80000000);
                            fStack_1bc = (float)(auVar102._4_4_ ^ 0x80000000);
                            wo_03.super_Tuple3<pbrt::Vector3,_float>.z = -auVar94._0_4_;
                            local_f8._0_8_ =
                                 CONCAT44(auVar101._0_4_,auVar94._0_4_) ^ 0x8000000080000000;
                            local_f8._8_4_ = auVar101._4_4_ ^ 0x80000000;
                            local_f8._12_4_ = auVar101._8_4_ ^ 0x80000000;
                            auVar102 = ZEXT856(local_f8._8_8_);
                            if (bVar48) {
                              wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)SUB84(local_1c8,0)
                              ;
                              wo_03.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)((ulong)local_1c8 >> 0x20);
                              auVar79 = ZEXT856(local_1c8._8_8_);
                              wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                              wi_02.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(undefined4)local_1b8;
                              wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                              SVar115 = ConductorBxDF::f(local_1d8,wo_03,wi_02,mode);
                              auVar95._0_8_ = SVar115.values.values._8_8_;
                              auVar95._8_56_ = auVar102;
                              auVar58 = auVar95._0_16_;
                              auVar73._0_8_ = SVar115.values.values._0_8_;
                              auVar73._8_56_ = auVar79;
                              auVar52 = auVar73._0_16_;
                            }
                            else {
                              wo_04.super_Tuple3<pbrt::Vector3,_float>.z =
                                   wo_03.super_Tuple3<pbrt::Vector3,_float>.z;
                              wo_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)SUB84(local_1c8,0)
                              ;
                              wo_04.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)((ulong)local_1c8 >> 0x20);
                              auVar79 = ZEXT856(local_1c8._8_8_);
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(undefined4)local_1b8;
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                              SVar115 = DielectricInterfaceBxDF::f(&this_00->top,wo_04,wi_03,mode);
                              auVar96._0_8_ = SVar115.values.values._8_8_;
                              auVar96._8_56_ = auVar102;
                              auVar58 = auVar96._0_16_;
                              auVar74._0_8_ = SVar115.values.values._0_8_;
                              auVar74._8_56_ = auVar79;
                              auVar52 = auVar74._0_16_;
                            }
                            auVar54 = _local_1c8;
                            local_168.f.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar52,auVar58);
                            if ((local_168.f.values.values[0] == 0.0) &&
                               (!NAN(local_168.f.values.values[0]))) {
                              uVar46 = 0;
                              while (uVar47 = uVar46, uVar47 != 3) {
                                fVar55 = local_168.f.values.values[uVar47 + 1];
                                if ((fVar55 != 0.0) || (uVar46 = uVar47 + 1, NAN(fVar55))) break;
                              }
                              if (2 < uVar47) goto LAB_003cef2a;
                            }
                            FVar56 = 0.0;
                            if (!bVar48) {
                              wo_05.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_f8._0_4_;
                              wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1c8._0_4_;
                              wo_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1c8._4_4_;
                              wi_04.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                              wi_04.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(undefined4)local_1b8;
                              wi_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                              _local_1c8 = auVar54;
                              FVar56 = DielectricInterfaceBxDF::PDF
                                                 (&this_00->top,wo_05,wi_04,mode,Transmission);
                            }
                            fVar55 = 1.0;
                            if (1.1754944e-38 < local_b8._0_4_) {
                              auVar26._8_4_ = 0x80000000;
                              auVar26._0_8_ = 0x8000000080000000;
                              auVar26._12_4_ = 0x80000000;
                              auVar52 = vxorps_avx512vl(local_b8,auVar26);
                              auVar27._8_4_ = 0x7fffffff;
                              auVar27._0_8_ = 0x7fffffff7fffffff;
                              auVar27._12_4_ = 0x7fffffff;
                              auVar58 = vandps_avx512vl(auVar94._0_16_,auVar27);
                              local_1c8._0_4_ = FVar56;
                              fVar55 = expf(auVar52._0_4_ / auVar58._0_4_);
                              FVar56 = (Float)local_1c8._0_4_;
                            }
                            auVar52 = vfmadd231ss_fma(ZEXT416((uint)(FVar56 * FVar56)),local_1e8,
                                                      local_1e8);
                            fVar105 = (local_1e8._0_4_ * local_1e8._0_4_) / auVar52._0_4_;
                            local_178 = fVar105 * fVar55 * (float)local_208 *
                                                  local_168.f.values.values[0] + local_178;
                            fStack_174 = fVar105 * fVar55 * afStack_204[0] *
                                                   local_168.f.values.values[1] + fStack_174;
                            fStack_170 = fVar105 * fVar55 * afStack_204[1] *
                                                   local_168.f.values.values[2] + fStack_170;
                            fStack_16c = fVar105 * fVar55 * afStack_204[2] *
                                                   local_168.f.values.values[3] + fStack_16c;
                          }
LAB_003cef2a:
                          bVar3 = false;
                          auVar53 = local_1f8;
                          auVar113 = auVar72._0_16_;
                          local_238 = auVar94._0_16_;
                        }
                      }
                    }
                    else {
                      *(long *)(in_FS_OFFSET + -0x130) = *(long *)(in_FS_OFFSET + -0x130) + 1;
                      bVar3 = false;
                      auVar53 = local_1e8;
                    }
                    auVar52 = in_ZMM8._0_16_;
                    uVar46 = uVar49;
                    if (bVar3) goto LAB_003cef3e;
                  }
                  else {
                    uVar49 = 0;
                    while (uVar47 = uVar49, uVar47 != 3) {
                      fVar105 = (this->albedo).values.values[uVar47 + 1];
                      if ((fVar105 != 0.0) || (uVar49 = uVar47 + 1, NAN(fVar105))) break;
                    }
                    if (uVar47 < 3) goto LAB_003ce72c;
                    FVar56 = this->thickness;
                    local_1f8 = ZEXT416((uint)FVar56);
                    auVar28._8_4_ = 0x7fffffff;
                    auVar28._0_8_ = 0x7fffffff7fffffff;
                    auVar28._12_4_ = 0x7fffffff;
                    auVar58 = vandps_avx512vl(ZEXT416((uint)FVar56),auVar28);
                    if (1.1754944e-38 < auVar58._0_4_) {
                      auVar29._8_4_ = 0x80000000;
                      auVar29._0_8_ = 0x8000000080000000;
                      auVar29._12_4_ = 0x80000000;
                      auVar58 = vxorps_avx512vl(auVar58,auVar29);
                      auVar30._8_4_ = 0x7fffffff;
                      auVar30._0_8_ = 0x7fffffff7fffffff;
                      auVar30._12_4_ = 0x7fffffff;
                      auVar54 = vandps_avx512vl(local_238,auVar30);
                      local_1f8 = ZEXT416((uint)FVar56);
                      fVar55 = expf(auVar58._0_4_ / auVar54._0_4_);
                    }
                    uVar51 = vcmpss_avx512f(local_1f8,ZEXT416((uint)local_1e8._0_4_),0);
                    auVar53._4_12_ = local_1f8._4_12_;
                    auVar53._0_4_ = (uint)!(bool)((byte)uVar51 & 1) * local_1f8._0_4_;
                    afStack_204[0] = fVar55 * afStack_204[0];
                    local_208 = (undefined1  [4])(fVar55 * (float)local_208);
                    afStack_204[1] = fVar55 * afStack_204[1];
                    afStack_204[2] = fVar55 * afStack_204[2];
LAB_003cef3e:
                    auVar58 = SUB6416(ZEXT464(0x3f800000),0);
                    bVar45 = (byte)(uVar46 >> 0x38);
                    uVar42 = (uint)(uVar46 >> 0x20);
                    local_1f8 = auVar53;
                    if ((auVar53._0_4_ != (float)local_a8._0_4_) ||
                       (NAN(auVar53._0_4_) || NAN((float)local_a8._0_4_))) {
                      if (bVar48) {
                        auVar54 = vminss_avx(ZEXT416((uint)(local_1a8->top).mfDistrib.alpha_y),
                                             ZEXT416((uint)(local_1a8->top).mfDistrib.alpha_x));
                        bVar40 = (auVar54._0_4_ < 0.001) * '\b' + 0xb;
                      }
                      else {
                        auVar54 = vminss_avx(ZEXT416((uint)(local_1a0->top).mfDistrib.alpha_x),
                                             ZEXT416((uint)(local_1a0->top).eta));
                        bVar40 = (auVar54._0_4_ < 0.001) * '\b' + 9;
                      }
                      auVar12._8_4_ = 0x80000000;
                      auVar12._0_8_ = 0x8000000080000000;
                      auVar12._12_4_ = 0x80000000;
                      auVar54 = vxorps_avx512vl(auVar113,auVar12);
                      uVar51 = auVar54._0_8_;
                      if (bVar40 < 0x10) {
                        if (bVar48) {
                          auVar65 = vminss_avx(ZEXT416((uint)(local_1d8->mfDistrib).alpha_y),
                                               ZEXT416((uint)(local_1d8->mfDistrib).alpha_x));
                          bVar40 = (auVar65._0_4_ < 0.001) * '\b' + 9;
                        }
                        else {
                          auVar65 = vminss_avx(ZEXT416((uint)(this_00->top).mfDistrib.alpha_y),
                                               ZEXT416((uint)(this_00->top).mfDistrib.alpha_x));
                          bVar40 = (auVar65._0_4_ < 0.001) * '\b' + 0xb;
                        }
                        if (bVar40 < 0x10) {
                          local_1e8._0_4_ = fStack_10c;
                          wo_08.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_238._0_4_;
                          wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               uStack_118 ^ 0x8000000080000000;
                          wi_05.super_Tuple3<pbrt::Vector3,_float>.z = -fStack_110;
                          if (bVar48) {
                            wo_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                            wo_08.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)((ulong)uVar51 >> 0x20);
                            fVar55 = DielectricInterfaceBxDF::PDF
                                               (&local_1a8->top,wo_08,wi_05,mode,All);
                          }
                          else {
                            wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                                 wo_08.super_Tuple3<pbrt::Vector3,_float>.z;
                            wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                            wo_09.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)((ulong)uVar51 >> 0x20);
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.z =
                                 wi_05.super_Tuple3<pbrt::Vector3,_float>.z;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(int)wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20
                                             );
                            fVar55 = ConductorBxDF::PDF((ConductorBxDF *)local_1a0,wo_09,wi_06,mode,
                                                        All);
                          }
                          auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * fVar55)),
                                                    ZEXT416((uint)local_1e8._0_4_),
                                                    ZEXT416((uint)local_1e8._0_4_));
                          auVar58 = ZEXT416((uint)(((float)local_1e8._0_4_ * (float)local_1e8._0_4_)
                                                  / auVar58._0_4_));
                        }
                        wo_10.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_238._0_4_;
                        auVar88._0_8_ = local_238._0_8_ ^ 0x8000000080000000;
                        auVar88._8_4_ = local_238._8_4_ ^ 0x80000000;
                        auVar88._12_4_ = local_238._12_4_ ^ 0x80000000;
                        wi_07.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             uStack_118 ^ 0x8000000080000000;
                        wi_07.super_Tuple3<pbrt::Vector3,_float>.z = -fStack_110;
                        local_1e8 = auVar58;
                        if (bVar48) {
                          wo_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                          wo_10.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)uVar51 >> 0x20);
                          auVar79 = ZEXT856(auVar88._8_8_);
                          auVar102 = ZEXT856(auVar54._8_8_);
                          SVar115 = DielectricInterfaceBxDF::f(&local_1a8->top,wo_10,wi_07,mode);
                          auVar97._0_8_ = SVar115.values.values._8_8_;
                          auVar97._8_56_ = auVar79;
                          auVar54 = auVar97._0_16_;
                          auVar75._0_8_ = SVar115.values.values._0_8_;
                          auVar75._8_56_ = auVar102;
                          auVar58 = auVar75._0_16_;
                        }
                        else {
                          wo_11.super_Tuple3<pbrt::Vector3,_float>.z =
                               wo_10.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                          wo_11.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)uVar51 >> 0x20);
                          auVar79 = ZEXT856(auVar88._8_8_);
                          auVar102 = ZEXT856(auVar54._8_8_);
                          wi_08.super_Tuple3<pbrt::Vector3,_float>.z =
                               wi_07.super_Tuple3<pbrt::Vector3,_float>.z;
                          wi_08.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)wi_07.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          wi_08.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(wi_07.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                          SVar115 = ConductorBxDF::f((ConductorBxDF *)local_1a0,wo_11,wi_08,mode);
                          auVar98._0_8_ = SVar115.values.values._8_8_;
                          auVar98._8_56_ = auVar79;
                          auVar54 = auVar98._0_16_;
                          auVar76._0_8_ = SVar115.values.values._0_8_;
                          auVar76._8_56_ = auVar102;
                          auVar58 = auVar76._0_16_;
                        }
                        auVar58 = vmovlhps_avx(auVar58,auVar54);
                        fVar55 = auVar58._0_4_ * (float)local_208;
                        fVar105 = auVar58._4_4_ * afStack_204[0];
                        fVar106 = auVar58._8_4_ * afStack_204[1];
                        fVar107 = auVar58._12_4_ * afStack_204[2];
                        auVar89._8_4_ = 0x7fffffff;
                        auVar89._0_8_ = 0x7fffffff7fffffff;
                        auVar89._12_4_ = 0x7fffffff;
                        auVar58 = vandps_avx(ZEXT416((uint)fStack_110),auVar89);
                        auVar54 = vandps_avx(ZEXT416((uint)this->thickness),auVar89);
                        fVar57 = 1.0;
                        if (1.1754944e-38 < auVar54._0_4_) {
                          auVar13._8_4_ = 0x80000000;
                          auVar13._0_8_ = 0x8000000080000000;
                          auVar13._12_4_ = 0x80000000;
                          auVar54 = vxorps_avx512vl(auVar54,auVar13);
                          local_1c8._4_4_ = fVar105;
                          local_1c8._0_4_ = fVar55;
                          fStack_1c0 = fVar106;
                          fStack_1bc = fVar107;
                          local_b8 = auVar58;
                          fVar57 = expf(auVar54._0_4_ / auVar58._0_4_);
                          auVar58 = local_b8;
                          fVar55 = (float)local_1c8._0_4_;
                          fVar105 = (float)local_1c8._4_4_;
                          fVar106 = fStack_1c0;
                          fVar107 = fStack_1bc;
                        }
                        fVar108 = auVar58._0_4_;
                        local_178 = fVar57 * (float)local_1e8._0_4_ * fVar108 * fVar55 *
                                    (float)local_58._0_4_ + local_178;
                        fStack_174 = fVar57 * (float)local_1e8._0_4_ * fVar108 * fVar105 *
                                     (float)local_58._4_4_ + fStack_174;
                        fStack_170 = fVar57 * (float)local_1e8._0_4_ * fVar108 * fVar106 * fStack_50
                                     + fStack_170;
                        fStack_16c = fVar57 * (float)local_1e8._0_4_ * fVar108 * fVar107 * fStack_4c
                                     + fStack_16c;
                      }
                      uVar42 = uVar42 >> 0xd ^ (uint)(uVar46 >> 0x1b);
                      bVar45 = bVar45 >> 3;
                      auVar35._4_12_ = in_register_00001444;
                      auVar35._0_4_ = in_XMM9_Da;
                      auVar58 = vcvtusi2ss_avx512f(auVar35,uVar42 >> bVar45 |
                                                           uVar42 << 0x20 - bVar45);
                      auVar58 = vminss_avx(ZEXT416((uint)(auVar58._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      uVar49 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                      uVar46 = uVar49 * 0x5851f42d4c957f2d + lVar2;
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ = uVar49;
                      auVar90._8_8_ = 0;
                      auVar90._0_8_ = uVar46;
                      auVar65 = vpunpcklqdq_avx(auVar67,auVar90);
                      auVar54 = vpsrlvq_avx2(auVar65,_DAT_0045e4d0);
                      auVar103 = vpsrlvq_avx2(auVar65,_DAT_0045e4e0);
                      auVar54 = vpshufd_avx(auVar54 ^ auVar103,0xe8);
                      auVar65 = vpsrlq_avx(auVar65,0x3b);
                      auVar65 = vpshufd_avx(auVar65,0xe8);
                      auVar54 = vprorvd_avx512vl(auVar54,auVar65);
                      auVar54 = vcvtudq2ps_avx512vl(auVar54);
                      auVar14._8_4_ = 0x2f800000;
                      auVar14._0_8_ = 0x2f8000002f800000;
                      auVar14._12_4_ = 0x2f800000;
                      auVar54 = vmulps_avx512vl(auVar54,auVar14);
                      auVar15._8_4_ = 0x3f7fffff;
                      auVar15._0_8_ = 0x3f7fffff3f7fffff;
                      auVar15._12_4_ = 0x3f7fffff;
                      auVar54 = vminps_avx512vl(auVar54,auVar15);
                      local_140 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar54);
                      auVar16._8_4_ = 0x80000000;
                      auVar16._0_8_ = 0x8000000080000000;
                      auVar16._12_4_ = 0x80000000;
                      auVar54 = vxorps_avx512vl(local_238,auVar16);
                      wo_12.super_Tuple3<pbrt::Vector3,_float>.z = auVar54._0_4_;
                      if (bVar48) {
                        in_ZMM8 = ZEXT1664(auVar52);
                        wo_12.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                        wo_12.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)((ulong)uVar51 >> 0x20);
                        DielectricInterfaceBxDF::Sample_f
                                  (&local_168,&local_1a8->top,wo_12,auVar58._0_4_,
                                   (Point2f *)&local_140,mode,Reflection);
                      }
                      else {
                        in_ZMM8 = ZEXT1664(auVar52);
                        wo_13.super_Tuple3<pbrt::Vector3,_float>.z =
                             wo_12.super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_13.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar51;
                        wo_13.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)((ulong)uVar51 >> 0x20);
                        ConductorBxDF::Sample_f
                                  (&local_168,(ConductorBxDF *)local_1a0,wo_13,auVar58._0_4_,
                                   (Point2f *)&local_140,mode,Reflection);
                      }
                      uVar49 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                      this_02 = local_60;
                      if ((local_168.pdf <= 0.0) ||
                         ((local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                          (!NAN(local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                      local_238._4_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._0_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._8_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._12_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar17._8_4_ = 0x7fffffff;
                      auVar17._0_8_ = 0x7fffffff7fffffff;
                      auVar17._12_4_ = 0x7fffffff;
                      auVar52 = vandps_avx512vl(local_238,auVar17);
                      auVar91._0_4_ = auVar52._0_4_ * local_168.f.values.values[0];
                      auVar91._4_4_ = auVar52._4_4_ * local_168.f.values.values[1];
                      auVar91._8_4_ = auVar52._8_4_ * local_168.f.values.values[2];
                      auVar91._12_4_ = auVar52._12_4_ * local_168.f.values.values[3];
                      auVar68._4_4_ = local_168.pdf;
                      auVar68._0_4_ = local_168.pdf;
                      auVar68._8_4_ = local_168.pdf;
                      auVar68._12_4_ = local_168.pdf;
                      auVar52 = vdivps_avx(auVar91,auVar68);
                      afStack_204[0] = auVar52._4_4_ * afStack_204[0];
                      local_208 = (undefined1  [4])(auVar52._0_4_ * (float)local_208);
                      afStack_204[1] = auVar52._8_4_ * afStack_204[1];
                      afStack_204[2] = auVar52._12_4_ * afStack_204[2];
                      if (bVar48) {
                        auVar52 = vminss_avx(ZEXT416((uint)(local_1d8->mfDistrib).alpha_y),
                                             ZEXT416((uint)(local_1d8->mfDistrib).alpha_x));
                        bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 9;
                      }
                      else {
                        auVar52 = vminss_avx(ZEXT416((uint)(this_00->top).mfDistrib.alpha_y),
                                             ZEXT416((uint)(this_00->top).mfDistrib.alpha_x));
                        bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 0xb;
                      }
                      auVar113._8_8_ = 0;
                      auVar113._0_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar113._4_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                      auVar53 = local_1f8;
                      if (bVar45 < 0x10) {
                        local_1e8._0_8_ =
                             local_168.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                             0x8000000080000000;
                        local_1e8._8_4_ = 0x80000000;
                        local_1e8._12_4_ = 0x80000000;
                        wo_14.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        local_1c8 = (undefined1  [8])
                                    (CONCAT44(local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                                              local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                    0x8000000080000000);
                        fStack_1c0 = -local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        fStack_1bc = -local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar102 = ZEXT856(local_1c8._8_8_);
                        if (bVar48) {
                          wo_14.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_1e8._0_8_;
                          wo_14.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)local_1e8._0_8_ >> 0x20);
                          auVar79 = ZEXT856(local_1e8._8_8_);
                          wi_09.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                          wi_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1b8;
                          wi_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                          SVar115 = ConductorBxDF::f(local_1d8,wo_14,wi_09,mode);
                          auVar99._0_8_ = SVar115.values.values._8_8_;
                          auVar99._8_56_ = auVar102;
                          auVar58 = auVar99._0_16_;
                          auVar77._0_8_ = SVar115.values.values._0_8_;
                          auVar77._8_56_ = auVar79;
                          auVar52 = auVar77._0_16_;
                        }
                        else {
                          wo_15.super_Tuple3<pbrt::Vector3,_float>.z =
                               wo_14.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_15.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_1e8._0_8_;
                          wo_15.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)local_1e8._0_8_ >> 0x20);
                          auVar79 = ZEXT856(local_1e8._8_8_);
                          wi_10.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                          wi_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1b8;
                          wi_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                          SVar115 = DielectricInterfaceBxDF::f(&this_00->top,wo_15,wi_10,mode);
                          auVar100._0_8_ = SVar115.values.values._8_8_;
                          auVar100._8_56_ = auVar102;
                          auVar58 = auVar100._0_16_;
                          auVar78._0_8_ = SVar115.values.values._0_8_;
                          auVar78._8_56_ = auVar79;
                          auVar52 = auVar78._0_16_;
                        }
                        auVar54 = local_1e8;
                        _local_138 = vmovlhps_avx(auVar52,auVar58);
                        if (((float)local_138 == 0.0) && (!NAN((float)local_138))) {
                          uVar46 = 0;
                          while (uVar47 = uVar46, uVar47 != 3) {
                            if ((*(float *)(local_138 + uVar47 * 4 + 4) != 0.0) ||
                               (uVar46 = uVar47 + 1, NAN(*(float *)(local_138 + uVar47 * 4 + 4))))
                            break;
                          }
                          auVar53 = local_1f8;
                          if (2 < uVar47) goto LAB_003cf7f6;
                        }
                        if (bVar48) {
                          auVar52 = vminss_avx(ZEXT416((uint)(local_1a8->top).mfDistrib.alpha_y),
                                               ZEXT416((uint)(local_1a8->top).mfDistrib.alpha_x));
                          bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 0xb;
                        }
                        else {
                          auVar52 = vminss_avx(ZEXT416((uint)(local_1a0->top).mfDistrib.alpha_x),
                                               ZEXT416((uint)(local_1a0->top).eta));
                          bVar45 = (auVar52._0_4_ < 0.001) * '\b' + 9;
                        }
                        auVar104 = SUB6416(ZEXT464(0x3f800000),0);
                        if (bVar45 < 0x10) {
                          fVar55 = 0.0;
                          if (!bVar48) {
                            wo_16.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1c8._0_4_;
                            wo_16.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1e8._0_4_;
                            wo_16.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
                            wi_11.super_Tuple3<pbrt::Vector3,_float>.z = local_188;
                            wi_11.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(undefined4)local_1b8;
                            wi_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
                            local_1e8 = auVar54;
                            fVar55 = DielectricInterfaceBxDF::PDF
                                               (&this_00->top,wo_16,wi_11,mode,Transmission);
                          }
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * fVar55)),
                                                    ZEXT416((uint)local_168.pdf),
                                                    ZEXT416((uint)local_168.pdf));
                          auVar104._0_4_ = (local_168.pdf * local_168.pdf) / auVar52._0_4_;
                          auVar104._4_12_ = SUB6012((undefined1  [60])0x0,0);
                        }
                        fVar55 = 1.0;
                        auVar18._8_4_ = 0x7fffffff;
                        auVar18._0_8_ = 0x7fffffff7fffffff;
                        auVar18._12_4_ = 0x7fffffff;
                        auVar52 = vandps_avx512vl(ZEXT416((uint)this->thickness),auVar18);
                        local_1e8 = auVar104;
                        if (1.1754944e-38 < auVar52._0_4_) {
                          auVar19._8_4_ = 0x80000000;
                          auVar19._0_8_ = 0x8000000080000000;
                          auVar19._12_4_ = 0x80000000;
                          auVar52 = vxorps_avx512vl(auVar52,auVar19);
                          auVar20._8_4_ = 0x7fffffff;
                          auVar20._0_8_ = 0x7fffffff7fffffff;
                          auVar20._12_4_ = 0x7fffffff;
                          auVar58 = vandps_avx512vl(ZEXT416((uint)local_168.wi.
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z),auVar20);
                          fVar55 = expf(auVar52._0_4_ / auVar58._0_4_);
                        }
                        fVar105 = local_1e8._0_4_;
                        local_178 = fVar105 * fVar55 * (float)local_208 * (float)local_138 +
                                    local_178;
                        fStack_174 = fVar105 * fVar55 * afStack_204[0] * afStack_134[0] + fStack_174
                        ;
                        fStack_170 = fVar105 * fVar55 * afStack_204[1] * afStack_134[1] + fStack_170
                        ;
                        fStack_16c = fVar105 * fVar55 * afStack_204[2] * afStack_134[2] + fStack_16c
                        ;
                        auVar53 = local_1f8;
                      }
                    }
                    else {
                      uVar42 = uVar42 >> 0xd ^ (uint)(uVar46 >> 0x1b);
                      bVar45 = bVar45 >> 3;
                      auVar34._4_12_ = in_register_00001444;
                      auVar34._0_4_ = in_XMM9_Da;
                      auVar58 = vcvtusi2ss_avx512f(auVar34,uVar42 >> bVar45 |
                                                           uVar42 << 0x20 - bVar45);
                      auVar58 = vminss_avx(ZEXT416((uint)(auVar58._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      uVar49 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                      uVar46 = uVar49 * 0x5851f42d4c957f2d + lVar2;
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = uVar49;
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar46;
                      auVar65 = vpunpcklqdq_avx(auVar64,auVar86);
                      auVar54 = vpsrlvq_avx2(auVar65,_DAT_0045e4d0);
                      auVar103 = vpsrlvq_avx2(auVar65,_DAT_0045e4e0);
                      auVar54 = vpshufd_avx(auVar54 ^ auVar103,0xe8);
                      auVar65 = vpsrlq_avx(auVar65,0x3b);
                      auVar65 = vpshufd_avx(auVar65,0xe8);
                      auVar54 = vprorvd_avx512vl(auVar54,auVar65);
                      auVar54 = vcvtudq2ps_avx512vl(auVar54);
                      auVar9._8_4_ = 0x2f800000;
                      auVar9._0_8_ = 0x2f8000002f800000;
                      auVar9._12_4_ = 0x2f800000;
                      auVar54 = vmulps_avx512vl(auVar54,auVar9);
                      auVar10._8_4_ = 0x3f7fffff;
                      auVar10._0_8_ = 0x3f7fffff3f7fffff;
                      auVar10._12_4_ = 0x3f7fffff;
                      auVar54 = vminps_avx512vl(auVar54,auVar10);
                      uVar51 = vmovlps_avx(auVar54);
                      _local_138 = uVar51;
                      wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           auVar113._0_8_ ^ 0x8000000080000000;
                      wo_06.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_238._0_4_;
                      if (bVar48) {
                        in_ZMM8 = ZEXT1664(auVar52);
                        ConductorBxDF::Sample_f
                                  (&local_168,local_1d8,wo_06,auVar58._0_4_,(Point2f *)local_138,
                                   mode,Reflection);
                      }
                      else {
                        in_ZMM8 = ZEXT1664(auVar52);
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.z =
                             wo_06.super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.x =
                             (float)(int)wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                        DielectricInterfaceBxDF::Sample_f
                                  (&local_168,&this_00->top,wo_07,auVar58._0_4_,(Point2f *)local_138
                                   ,mode,Reflection);
                      }
                      uVar49 = uVar46 * 0x5851f42d4c957f2d + lVar2;
                      this_02 = local_60;
                      if ((local_168.pdf <= 0.0) ||
                         ((local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                          (!NAN(local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                      local_238._4_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._0_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._8_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      local_238._12_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar11._8_4_ = 0x7fffffff;
                      auVar11._0_8_ = 0x7fffffff7fffffff;
                      auVar11._12_4_ = 0x7fffffff;
                      auVar52 = vandps_avx512vl(local_238,auVar11);
                      auVar87._0_4_ = auVar52._0_4_ * local_168.f.values.values[0];
                      auVar87._4_4_ = auVar52._4_4_ * local_168.f.values.values[1];
                      auVar87._8_4_ = auVar52._8_4_ * local_168.f.values.values[2];
                      auVar87._12_4_ = auVar52._12_4_ * local_168.f.values.values[3];
                      auVar66._4_4_ = local_168.pdf;
                      auVar66._0_4_ = local_168.pdf;
                      auVar66._8_4_ = local_168.pdf;
                      auVar66._12_4_ = local_168.pdf;
                      auVar52 = vdivps_avx(auVar87,auVar66);
                      afStack_204[0] = auVar52._4_4_ * afStack_204[0];
                      local_208 = (undefined1  [4])(auVar52._0_4_ * (float)local_208);
                      afStack_204[1] = auVar52._8_4_ * afStack_204[1];
                      afStack_204[2] = auVar52._12_4_ * afStack_204[2];
                      auVar113._8_8_ = 0;
                      auVar113._0_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar113._4_4_ = local_168.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                      auVar53 = local_1f8;
                    }
                  }
LAB_003cf7f6:
                  uVar41 = uVar41 + 1;
                  auVar112 = ZEXT1664(auVar113);
                  uVar46 = uVar49;
                  this_02 = local_60;
                  local_1e8 = auVar53;
                  if ((this->config).maxDepth <= uVar41) break;
                } while( true );
              }
            }
          }
        }
      }
      uVar50 = uVar50 + 1;
      bVar45 = (this->config).nSamples;
    } while (uVar50 < bVar45);
  }
  auVar69._0_4_ = (float)bVar45;
  auVar69._4_4_ = auVar69._0_4_;
  auVar69._8_4_ = auVar69._0_4_;
  auVar69._12_4_ = auVar69._0_4_;
  auVar38._4_4_ = fStack_174;
  auVar38._0_4_ = local_178;
  auVar38._8_4_ = fStack_170;
  auVar38._12_4_ = fStack_16c;
  auVar52 = vdivps_avx(auVar38,auVar69);
  auVar58 = vshufpd_avx(auVar52,auVar52,1);
  SVar115.values.values._0_8_ = auVar52._0_8_;
  SVar115.values.values._8_8_ = auVar58._0_8_;
  return (SampledSpectrum)SVar115.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance and exit interfaces for layered BSDF
        bool enteredTop = wo.z > 0;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface, exitInterface;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> nonExitInterface;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample wos = enterInterface.Sample_f(wo, uc, u, mode,
                                                     BxDFReflTransFlags::Transmission);
            if (!wos || wos.wi.z == 0)
                continue;

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            u = Point2f(r(), r());
            BSDFSample wis = exitInterface.Sample_f(wi, uc, u, ~mode,
                                                    BxDFReflTransFlags::Transmission);
            if (!wis || wis.wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos.f * AbsCosTheta(wos.wi) / wos.pdf;
            SampledSpectrum betaExit = wis.f / wis.pdf;
            Vector3f w = wos.wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < .25) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                if (albedo) {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//beta *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
beta *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
beta /= AbsCosTheta(w);
#endif
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1, phase.PDF(-w, -wis.wi));
                        Float te = Tr(zp - exitZ, wis.wi);
                        f += beta * albedo * phase.p(-w, -wis.wi) * wt * te * betaExit;

                        // Sample phase function and update layered path state
                        PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps.wi.z == 0)
                            continue;
                        beta *= albedo * ps.p / ps.pdf;
                        w = ps.wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps.pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps.wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);

                } else {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);
                }
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = exitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.pdf == 0 || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1,
                                                nonExitInterface.PDF(-w, -wis.wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis.wi, mode) *
                             AbsCosTheta(wis.wi) * wt * Tr(thickness, wis.wi) * betaExit;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs.pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs.wi) * fExit * wt;
                        }
                    }
                }
            }
        }
        return f / config.nSamples;
    }